

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Detonation_PDU::Detonation_PDU
          (Detonation_PDU *this,Warfare_Header *WarfareHeader,Vector *Velocity,
          WorldCoordinates *LocationWorldCoords,DescPtr *Desc,Vector *LocationEntityCoords,
          DetonationResult DetonationResult)

{
  KFLOAT64 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KUINT16 KVar5;
  KFLOAT32 KVar6;
  DescPtr local_28;
  
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Header6_00220c70;
  KVar2 = (WarfareHeader->super_Header).super_Header6.m_ui8ExerciseID;
  KVar3 = (WarfareHeader->super_Header).super_Header6.m_ui8PDUType;
  KVar4 = (WarfareHeader->super_Header).super_Header6.m_ui8ProtocolFamily;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8ProtocolVersion =
       (WarfareHeader->super_Header).super_Header6.m_ui8ProtocolVersion;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8ExerciseID = KVar2;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8PDUType = KVar3;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8ProtocolFamily = KVar4;
  (this->super_Warfare_Header).super_Header.super_Header6.m_TimeStamp.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__TimeStamp_00220cf8;
  (this->super_Warfare_Header).super_Header.super_Header6.m_TimeStamp.m_TimeStampUnion =
       (WarfareHeader->super_Header).super_Header6.m_TimeStamp.m_TimeStampUnion;
  (this->super_Warfare_Header).super_Header.super_Header6.m_TimeStamp.m_bAutoCalcRel =
       (WarfareHeader->super_Header).super_Header6.m_TimeStamp.m_bAutoCalcRel;
  KVar2 = (WarfareHeader->super_Header).super_Header6.m_ui8Padding1;
  KVar3 = (WarfareHeader->super_Header).super_Header6.m_ui8Padding2;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui16PDULength =
       (WarfareHeader->super_Header).super_Header6.m_ui16PDULength;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8Padding1 = KVar2;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8Padding2 = KVar3;
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Header7_00221450;
  (this->super_Warfare_Header).super_Header.super_Header6.field_0x26 =
       (WarfareHeader->super_Header).super_Header6.field_0x26;
  *(undefined2 *)&(this->super_Warfare_Header).super_Header.super_Header6.field_0x24 =
       *(undefined2 *)&(WarfareHeader->super_Header).super_Header6.field_0x24;
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Warfare_Header_00223550;
  (this->super_Warfare_Header).m_FiringEntityID.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__SimulationIdentifier_00223f60;
  KVar5 = (WarfareHeader->m_FiringEntityID).super_SimulationIdentifier.m_ui16ApplicationID;
  (this->super_Warfare_Header).m_FiringEntityID.super_SimulationIdentifier.m_ui16SiteID =
       (WarfareHeader->m_FiringEntityID).super_SimulationIdentifier.m_ui16SiteID;
  (this->super_Warfare_Header).m_FiringEntityID.super_SimulationIdentifier.m_ui16ApplicationID =
       KVar5;
  (this->super_Warfare_Header).m_FiringEntityID.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__EntityIdentifier_00223c00;
  *(undefined2 *)&(this->super_Warfare_Header).m_FiringEntityID.super_SimulationIdentifier.field_0xc
       = *(undefined2 *)&(WarfareHeader->m_FiringEntityID).super_SimulationIdentifier.field_0xc;
  (this->super_Warfare_Header).m_TargetEntityID.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__SimulationIdentifier_00223f60;
  KVar5 = (WarfareHeader->m_TargetEntityID).super_SimulationIdentifier.m_ui16ApplicationID;
  (this->super_Warfare_Header).m_TargetEntityID.super_SimulationIdentifier.m_ui16SiteID =
       (WarfareHeader->m_TargetEntityID).super_SimulationIdentifier.m_ui16SiteID;
  (this->super_Warfare_Header).m_TargetEntityID.super_SimulationIdentifier.m_ui16ApplicationID =
       KVar5;
  (this->super_Warfare_Header).m_TargetEntityID.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__EntityIdentifier_00223c00;
  *(undefined2 *)&(this->super_Warfare_Header).m_TargetEntityID.super_SimulationIdentifier.field_0xc
       = *(undefined2 *)&(WarfareHeader->m_TargetEntityID).super_SimulationIdentifier.field_0xc;
  (this->super_Warfare_Header).m_MunitionID.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__SimulationIdentifier_00223f60;
  KVar5 = (WarfareHeader->m_MunitionID).super_SimulationIdentifier.m_ui16ApplicationID;
  (this->super_Warfare_Header).m_MunitionID.super_SimulationIdentifier.m_ui16SiteID =
       (WarfareHeader->m_MunitionID).super_SimulationIdentifier.m_ui16SiteID;
  (this->super_Warfare_Header).m_MunitionID.super_SimulationIdentifier.m_ui16ApplicationID = KVar5;
  (this->super_Warfare_Header).m_MunitionID.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__EntityIdentifier_00223c00;
  *(undefined2 *)&(this->super_Warfare_Header).m_MunitionID.super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(WarfareHeader->m_MunitionID).super_SimulationIdentifier.field_0xc;
  (this->super_Warfare_Header).m_EventID.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__SimulationIdentifier_00223f60;
  KVar5 = (WarfareHeader->m_EventID).super_SimulationIdentifier.m_ui16ApplicationID;
  (this->super_Warfare_Header).m_EventID.super_SimulationIdentifier.m_ui16SiteID =
       (WarfareHeader->m_EventID).super_SimulationIdentifier.m_ui16SiteID;
  (this->super_Warfare_Header).m_EventID.super_SimulationIdentifier.m_ui16ApplicationID = KVar5;
  (this->super_Warfare_Header).m_EventID.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__EntityIdentifier_00223c00;
  *(undefined2 *)&(this->super_Warfare_Header).m_EventID.super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(WarfareHeader->m_EventID).super_SimulationIdentifier.field_0xc;
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Detonation_PDU_00223470;
  (this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002241d0;
  KVar6 = Velocity->m_f32Y;
  (this->m_Velocity).m_f32X = Velocity->m_f32X;
  (this->m_Velocity).m_f32Y = KVar6;
  (this->m_Velocity).m_f32Z = Velocity->m_f32Z;
  (this->m_LocationWorldCoords).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00224228;
  KVar1 = LocationWorldCoords->m_f64Y;
  (this->m_LocationWorldCoords).m_f64X = LocationWorldCoords->m_f64X;
  (this->m_LocationWorldCoords).m_f64Y = KVar1;
  (this->m_LocationWorldCoords).m_f64Z = LocationWorldCoords->m_f64Z;
  (this->m_pDescriptor)._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_002234c8;
  (this->m_pDescriptor).m_pRef = (Descriptor *)0x0;
  (this->m_pDescriptor).m_piCount = (RefCounter *)0x0;
  (this->m_LocationEntityCoords).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002241d0;
  KVar6 = LocationEntityCoords->m_f32Y;
  (this->m_LocationEntityCoords).m_f32X = LocationEntityCoords->m_f32X;
  (this->m_LocationEntityCoords).m_f32Y = KVar6;
  (this->m_LocationEntityCoords).m_f32Z = LocationEntityCoords->m_f32Z;
  this->m_ui8DetonationResult = (undefined1)DetonationResult;
  this->m_ui8NumOfVariableParams = '\0';
  this->m_ui16Padding1 = 0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8PDUType = '\x03';
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui16PDULength = 0x68;
  local_28._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_002234c8;
  local_28.m_pRef = Desc->m_pRef;
  local_28.m_piCount = Desc->m_piCount;
  if (local_28.m_pRef != (Descriptor *)0x0) {
    *local_28.m_piCount = *local_28.m_piCount + 1;
  }
  SetDescriptor(this,&local_28);
  local_28._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_002234c8;
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::unRef(&local_28);
  return;
}

Assistant:

Detonation_PDU::Detonation_PDU( const Warfare_Header & WarfareHeader, const Vector & Velocity,
                                const WorldCoordinates & LocationWorldCoords, DescPtr Desc,
                                const Vector & LocationEntityCoords, DetonationResult DetonationResult ) :
    Warfare_Header( WarfareHeader ),
    m_Velocity( Velocity ),
    m_LocationWorldCoords( LocationWorldCoords ),
    m_LocationEntityCoords( LocationEntityCoords ),
    m_ui8DetonationResult( DetonationResult ),
    m_ui8NumOfVariableParams( 0 ),
    m_ui16Padding1( 0 )
{
    m_ui8PDUType = Detonation_PDU_Type;
    m_ui16PDULength = DETONATION_PDU_SIZE;
    SetDescriptor( Desc );
}